

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

Qiniu_Error
Qiniu_Rio_bput(Qiniu_Client *self,Qiniu_Rio_BlkputRet *ret,Qiniu_Reader body,int bodyLength,
              char *url,_Qiniu_Progress_Callback_Data_conflict *progressCallback)

{
  Qiniu_Error QVar1;
  _Qiniu_Progress_Callback_Data_conflict *local_90;
  void *callbackData;
  _func_int_void_ptr_double_double_double_double *callback;
  Qiniu_Json *root;
  Qiniu_Rio_BlkputRet retFromResp;
  char *url_local;
  int bodyLength_local;
  Qiniu_Rio_BlkputRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Reader body_local;
  Qiniu_Error err;
  
  callbackData = (void *)0x0;
  local_90 = (_Qiniu_Progress_Callback_Data_conflict *)0x0;
  if ((progressCallback != (_Qiniu_Progress_Callback_Data_conflict *)0x0) &&
     (progressCallback->callback != (_func_void_size_t_size_t *)0x0)) {
    callbackData = _Qiniu_Progress_Callback;
    local_90 = progressCallback;
  }
  retFromResp._40_8_ = url;
  QVar1 = Qiniu_Client_CallWithBinaryAndProgressCallback
                    (self,(Qiniu_Json **)&callback,url,body,(long)bodyLength,(char *)0x0,
                     (_func_int_void_ptr_double_double_double_double *)callbackData,local_90);
  err._0_8_ = QVar1.message;
  body_local.Read._0_4_ = QVar1.code;
  if ((uint)body_local.Read == 200) {
    root = (Qiniu_Json *)Qiniu_Json_GetString((Qiniu_Json *)callback,"ctx",(char *)0x0);
    retFromResp.ctx = Qiniu_Json_GetString((Qiniu_Json *)callback,"checksum",(char *)0x0);
    retFromResp.expiredAt =
         (Qiniu_Uint64)Qiniu_Json_GetString((Qiniu_Json *)callback,"host",(char *)0x0);
    retFromResp.checksum._0_4_ = Qiniu_Json_GetUInt32((Qiniu_Json *)callback,"crc32",0);
    retFromResp.checksum._4_4_ = Qiniu_Json_GetUInt32((Qiniu_Json *)callback,"offset",0);
    retFromResp._16_8_ = Qiniu_Json_GetUInt64((Qiniu_Json *)callback,"expired_at",0);
    if (((root == (Qiniu_Json *)0x0) || (retFromResp.expiredAt == 0)) ||
       (retFromResp.checksum._4_4_ == 0)) {
      body_local.Read._0_4_ = 0x270e;
      err._0_8_ = anon_var_dwarf_f13c;
    }
    else {
      Qiniu_Rio_BlkputRet_Assign(ret,(Qiniu_Rio_BlkputRet *)&root);
    }
  }
  QVar1._4_4_ = 0;
  QVar1.code = (uint)body_local.Read;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

static Qiniu_Error Qiniu_Rio_bput(Qiniu_Client *self, Qiniu_Rio_BlkputRet *ret, Qiniu_Reader body, int bodyLength, const char *url, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Rio_BlkputRet retFromResp;
    Qiniu_Json *root;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    Qiniu_Error err = Qiniu_Client_CallWithBinaryAndProgressCallback(self, &root, url, body, bodyLength, NULL, callback, callbackData);
    if (err.code == 200)
    {
        retFromResp.ctx = Qiniu_Json_GetString(root, "ctx", NULL);
        retFromResp.checksum = Qiniu_Json_GetString(root, "checksum", NULL);
        retFromResp.host = Qiniu_Json_GetString(root, "host", NULL);
        retFromResp.crc32 = Qiniu_Json_GetUInt32(root, "crc32", 0);
        retFromResp.offset = Qiniu_Json_GetUInt32(root, "offset", 0);
        retFromResp.expiredAt = Qiniu_Json_GetUInt64(root, "expired_at", 0);

        if (retFromResp.ctx == NULL || retFromResp.host == NULL || retFromResp.offset == 0)
        {
            err.code = 9998;
            err.message = "unexpected response: invalid ctx, host or offset";
            return err;
        }

        Qiniu_Rio_BlkputRet_Assign(ret, &retFromResp);
    }

    return err;
}